

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O1

void obj_list(t_object *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  word *pwVar2;
  _inlet *x_00;
  bool bVar3;
  
  if (argc == 0) {
    pd_emptylist((t_pd *)x);
    return;
  }
  x_00 = x->te_inlet;
  if (argc != 1 && x_00 != (_inlet *)0x0) {
    iVar1 = argc + -2;
    pwVar2 = &argv[1].a_w;
    do {
      if ((t_float)((t_atom *)(pwVar2 + -1))->a_type == 1.4013e-45) {
        pd_float(&x_00->i_pd,pwVar2->w_float);
      }
      else if ((t_float)((t_atom *)(pwVar2 + -1))->a_type == 4.2039e-45) {
        pd_pointer(&x_00->i_pd,pwVar2->w_gpointer);
      }
      else {
        pd_symbol(&x_00->i_pd,pwVar2->w_symbol);
      }
      x_00 = x_00->i_next;
      bVar3 = iVar1 != 0;
      iVar1 = iVar1 + -1;
    } while ((x_00 != (_inlet *)0x0) && (pwVar2 = pwVar2 + 2, bVar3));
  }
  if (argv->a_type != A_FLOAT) {
    if (argv->a_type == A_POINTER) {
      pd_pointer((t_pd *)x,(argv->a_w).w_gpointer);
      return;
    }
    pd_symbol((t_pd *)x,(argv->a_w).w_symbol);
    return;
  }
  pd_float((t_pd *)x,(argv->a_w).w_float);
  return;
}

Assistant:

void obj_list(t_object *x, t_symbol *s, int argc, t_atom *argv)
{
    t_atom *ap;
    int count;
    t_inlet *ip = ((t_object *)x)->ob_inlet;
    if (!argc)
    {
        pd_emptylist(&x->ob_pd);
        return;
    }
    for (count = argc-1, ap = argv+1; ip && count--; ap++, ip = ip->i_next)
    {
        if (ap->a_type == A_POINTER) pd_pointer(&ip->i_pd, ap->a_w.w_gpointer);
        else if (ap->a_type == A_FLOAT) pd_float(&ip->i_pd, ap->a_w.w_float);
        else pd_symbol(&ip->i_pd, ap->a_w.w_symbol);
    }
    if (argv->a_type == A_POINTER) pd_pointer(&x->ob_pd, argv->a_w.w_gpointer);
    else if (argv->a_type == A_FLOAT) pd_float(&x->ob_pd, argv->a_w.w_float);
    else pd_symbol(&x->ob_pd, argv->a_w.w_symbol);
}